

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O2

int demoTruncate(unqlite_file *pFile,unqlite_int64 size)

{
  return 0;
}

Assistant:

static int demoTruncate(unqlite_file *pFile, unqlite_int64 size){
#if defined(HAVE_FTRUNCATE)
  int rc;
  rc = ftruncate(((DemoFile *)pFile)->fd, (off_t)size);
  if( rc ){
    return UNQLITE_IOERR;
  }
#endif
  return UNQLITE_OK;
}